

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delta.c
# Opt level: O1

void Delta_Encode(Byte *state,uint delta,Byte *data,SizeT size)

{
  long lVar1;
  Byte BVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong __n;
  size_t __n_00;
  Byte buf [256];
  Byte local_138 [264];
  
  __n = (ulong)delta;
  if (delta != 0) {
    memcpy(local_138,state,__n);
  }
  __n_00 = 0;
  uVar4 = 0;
  if (size != 0) {
    uVar3 = 0;
    do {
      if (delta == 0) {
        uVar5 = 0;
      }
      else {
        uVar6 = 0;
        do {
          BVar2 = data[uVar6 + uVar3];
          data[uVar6 + uVar3] = BVar2 - local_138[uVar6];
          local_138[uVar6] = BVar2;
          uVar5 = uVar6 + 1;
          if (__n <= uVar5) break;
          lVar1 = uVar6 + uVar3;
          uVar6 = uVar5;
        } while (lVar1 + 1U < size);
        uVar3 = uVar3 + uVar5;
      }
      uVar4 = (uint)uVar5;
    } while (uVar3 < size);
  }
  if (uVar4 != delta) {
    __n_00 = (size_t)uVar4;
  }
  if (delta != (uint)__n_00) {
    memcpy(state,local_138 + __n_00,(ulong)(delta - (uint)__n_00));
  }
  if (__n_00 != 0) {
    memcpy(state + (__n - __n_00),local_138,__n_00);
  }
  return;
}

Assistant:

void Delta_Encode(Byte *state, unsigned delta, Byte *data, SizeT size)
{
  Byte buf[DELTA_STATE_SIZE];
  unsigned j = 0;
  MyMemCpy(buf, state, delta);
  {
    SizeT i;
    for (i = 0; i < size;)
    {
      for (j = 0; j < delta && i < size; i++, j++)
      {
        Byte b = data[i];
        data[i] = (Byte)(b - buf[j]);
        buf[j] = b;
      }
    }
  }
  if (j == delta)
    j = 0;
  MyMemCpy(state, buf + j, delta - j);
  MyMemCpy(state + delta - j, buf, j);
}